

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lax_der_parsing.c
# Opt level: O1

int ecdsa_signature_parse_der_lax
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar6;
  size_t sVar7;
  size_t __n;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  uchar tmpsig [64];
  uchar local_78 [72];
  int iVar5;
  
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  secp256k1_ecdsa_signature_parse_compact(ctx,sig,local_78);
  iVar4 = 0;
  iVar5 = 0;
  if (((inputlen != 0) && (inputlen != 1)) && (*input == '0')) {
    bVar2 = input[1];
    sVar6 = 2;
    if ((char)bVar2 < '\0') {
      if (inputlen - 2 < (ulong)bVar2 - 0x80) {
        return 0;
      }
      sVar6 = (ulong)bVar2 - 0x7e;
    }
    iVar4 = iVar5;
    if (((sVar6 != inputlen) && (input[sVar6] == '\x02')) && (sVar6 + 1 != inputlen)) {
      sVar7 = sVar6 + 2;
      __n = (size_t)input[sVar6 + 1];
      if ((char)input[sVar6 + 1] < '\0') {
        uVar8 = __n - 0x80;
        if (inputlen - sVar7 < uVar8) {
          return 0;
        }
        if (uVar8 != 0) {
          do {
            if (input[sVar7] != '\0') goto LAB_00126044;
            sVar7 = sVar7 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
          uVar8 = 0;
          sVar7 = (sVar6 + __n) - 0x7e;
        }
LAB_00126044:
        if (7 < uVar8) {
          return 0;
        }
        if (uVar8 == 0) {
          __n = 0;
        }
        else {
          uVar9 = 0;
          __n = 0;
          do {
            __n = (ulong)input[uVar9 + sVar7] | __n << 8;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
          sVar7 = sVar7 + uVar8;
        }
      }
      if (((__n <= inputlen - sVar7) && (sVar6 = sVar7 + __n, sVar6 != inputlen)) &&
         ((input[sVar6] == '\x02' && (sVar6 + 1 != inputlen)))) {
        lVar11 = sVar6 + 2;
        uVar8 = (ulong)input[sVar6 + 1];
        if ((char)input[sVar6 + 1] < '\0') {
          uVar9 = uVar8 - 0x80;
          if (inputlen - lVar11 < uVar9) {
            return 0;
          }
          if (uVar9 != 0) {
            do {
              if (input[lVar11] != '\0') goto LAB_001261a3;
              lVar11 = lVar11 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
            uVar9 = 0;
            lVar11 = sVar7 + __n + uVar8 + -0x7e;
          }
LAB_001261a3:
          if (7 < uVar9) {
            return 0;
          }
          if (uVar9 == 0) {
            uVar8 = 0;
          }
          else {
            uVar10 = 0;
            uVar8 = 0;
            do {
              uVar8 = (ulong)input[uVar10 + lVar11] | uVar8 << 8;
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
            lVar11 = lVar11 + uVar9;
          }
        }
        if (uVar8 <= inputlen - lVar11) {
          if (__n != 0) {
            do {
              if (input[sVar7] != '\0') goto LAB_001260ce;
              sVar7 = sVar7 + 1;
              __n = __n - 1;
            } while (__n != 0);
            __n = 0;
            sVar7 = sVar6;
          }
LAB_001260ce:
          bVar12 = 0xffffffffffffffdf < __n - 0x21;
          if (bVar12) {
            memcpy(local_78 + (0x20 - __n),input + sVar7,__n);
          }
          bVar12 = !bVar12 && 0x20 < __n;
          if (uVar8 != 0) {
            lVar1 = lVar11 + uVar8;
            do {
              if (input[lVar11] != '\0') goto LAB_00126121;
              lVar11 = lVar11 + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
            uVar8 = 0;
            lVar11 = lVar1;
          }
LAB_00126121:
          bVar3 = 0x20 < uVar8 || bVar12;
          if (0xffffffffffffffdf < uVar8 - 0x21) {
            memcpy(local_78 + (0x40 - uVar8),input + lVar11,uVar8);
            bVar3 = bVar12;
          }
          if ((!bVar3) &&
             (iVar4 = secp256k1_ecdsa_signature_parse_compact(ctx,sig,local_78), iVar4 != 0)) {
            return 1;
          }
          local_78[0x30] = '\0';
          local_78[0x31] = '\0';
          local_78[0x32] = '\0';
          local_78[0x33] = '\0';
          local_78[0x34] = '\0';
          local_78[0x35] = '\0';
          local_78[0x36] = '\0';
          local_78[0x37] = '\0';
          local_78[0x38] = '\0';
          local_78[0x39] = '\0';
          local_78[0x3a] = '\0';
          local_78[0x3b] = '\0';
          local_78[0x3c] = '\0';
          local_78[0x3d] = '\0';
          local_78[0x3e] = '\0';
          local_78[0x3f] = '\0';
          local_78[0x20] = '\0';
          local_78[0x21] = '\0';
          local_78[0x22] = '\0';
          local_78[0x23] = '\0';
          local_78[0x24] = '\0';
          local_78[0x25] = '\0';
          local_78[0x26] = '\0';
          local_78[0x27] = '\0';
          local_78[0x28] = '\0';
          local_78[0x29] = '\0';
          local_78[0x2a] = '\0';
          local_78[0x2b] = '\0';
          local_78[0x2c] = '\0';
          local_78[0x2d] = '\0';
          local_78[0x2e] = '\0';
          local_78[0x2f] = '\0';
          local_78[0x10] = '\0';
          local_78[0x11] = '\0';
          local_78[0x12] = '\0';
          local_78[0x13] = '\0';
          local_78[0x14] = '\0';
          local_78[0x15] = '\0';
          local_78[0x16] = '\0';
          local_78[0x17] = '\0';
          local_78[0x18] = '\0';
          local_78[0x19] = '\0';
          local_78[0x1a] = '\0';
          local_78[0x1b] = '\0';
          local_78[0x1c] = '\0';
          local_78[0x1d] = '\0';
          local_78[0x1e] = '\0';
          local_78[0x1f] = '\0';
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          local_78[8] = '\0';
          local_78[9] = '\0';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          secp256k1_ecdsa_signature_parse_compact(ctx,sig,local_78);
          iVar4 = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ecdsa_signature_parse_der_lax(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else if (rlen) {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else if (slen) {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    if (overflow) {
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    return 1;
}